

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

void DiagnoseAncientPolicies
               (vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *ancient,
               uint majorVer,uint minorVer,uint patchVer,cmMakefile *mf)

{
  bool bVar1;
  ostream *poVar2;
  reference pPVar3;
  char *pcVar4;
  string local_1f0;
  PolicyID local_1cc;
  const_iterator cStack_1c8;
  PolicyID i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *__range1;
  undefined1 local_1a0 [8];
  ostringstream e;
  cmMakefile *mf_local;
  uint patchVer_local;
  uint minorVer_local;
  uint majorVer_local;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *ancient_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,
                           "The project requests behavior compatible with CMake version \"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,majorVer);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,minorVer);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,patchVer);
  std::operator<<(poVar2,"\", which requires the OLD behavior for some policies:\n");
  __end1 = std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::begin(ancient);
  cStack_1c8 = std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::end
                         (ancient);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe38);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_cmPolicies::PolicyID_*,_std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>_>
             ::operator*(&__end1);
    local_1cc = *pPVar3;
    poVar2 = std::operator<<((ostream *)local_1a0,"  ");
    pcVar4 = idToString(local_1cc);
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2,": ");
    pcVar4 = idToShortDescription(local_1cc);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_cmPolicies::PolicyID_*,_std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>_>
    ::operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)local_1a0,
                           "However, this version of CMake no longer supports the OLD ");
  poVar2 = std::operator<<(poVar2,"behavior for these policies.  ");
  poVar2 = std::operator<<(poVar2,"Please either update your CMakeLists.txt files to conform to ");
  poVar2 = std::operator<<(poVar2,"the new behavior or use an older version of CMake that still ");
  std::operator<<(poVar2,"supports the old behavior.");
  std::__cxx11::ostringstream::str();
  cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

static void DiagnoseAncientPolicies(
  std::vector<cmPolicies::PolicyID> const& ancient, unsigned int majorVer,
  unsigned int minorVer, unsigned int patchVer, cmMakefile* mf)
{
  std::ostringstream e;
  e << "The project requests behavior compatible with CMake version \""
    << majorVer << "." << minorVer << "." << patchVer
    << "\", which requires the OLD behavior for some policies:\n";
  for (cmPolicies::PolicyID i : ancient) {
    e << "  " << idToString(i) << ": " << idToShortDescription(i) << "\n";
  }
  e << "However, this version of CMake no longer supports the OLD "
    << "behavior for these policies.  "
    << "Please either update your CMakeLists.txt files to conform to "
    << "the new behavior or use an older version of CMake that still "
    << "supports the old behavior.";
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
}